

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

PHYSFS_Io * ZIP_duplicate(PHYSFS_Io *io)

{
  undefined8 *puVar1;
  ZIPentry *entry;
  undefined4 uVar2;
  int iVar3;
  PHYSFS_Io *pPVar4;
  long *__s;
  PHYSFS_Io *pPVar5;
  void *pvVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  puVar1 = (undefined8 *)io->opaque;
  pPVar4 = (PHYSFS_Io *)(*__PHYSFS_AllocatorHooks.Malloc)(0x50);
  __s = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(0xa8);
  if (__s != (long *)0x0 && pPVar4 != (PHYSFS_Io *)0x0) {
    memset(__s,0,0xa8);
    entry = (ZIPentry *)*puVar1;
    *__s = (long)entry;
    iVar3 = 0;
    pPVar5 = zip_get_io((PHYSFS_Io *)puVar1[1],(ZIPinfo *)0x0,entry);
    __s[1] = (long)pPVar5;
    if (pPVar5 == (PHYSFS_Io *)0x0) goto LAB_00119a89;
    __s[0xf] = 0;
    __s[0x10] = 0;
    __s[0x11] = 0;
    __s[0x12] = 0;
    __s[0x13] = 0;
    __s[0x14] = 0;
    __s[0xd] = 0;
    __s[0xe] = 0;
    __s[0xb] = 0;
    __s[0xc] = 0;
    __s[9] = 0;
    __s[10] = 0;
    __s[7] = 0;
    __s[8] = 0;
    __s[0xf] = (long)zlibPhysfsAlloc;
    __s[0x10] = (long)zlibPhysfsFree;
    __s[0x11] = (long)&__PHYSFS_AllocatorHooks;
    if (*(short *)(*__s + 0x46) == 0) {
LAB_00119aed:
      pPVar5 = pPVar4;
      for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
        uVar2 = *(undefined4 *)&io->field_0x4;
        pPVar5->version = io->version;
        *(undefined4 *)&pPVar5->field_0x4 = uVar2;
        io = (PHYSFS_Io *)((long)io + (ulong)bVar8 * -0x10 + 8);
        pPVar5 = (PHYSFS_Io *)((long)pPVar5 + (ulong)bVar8 * -0x10 + 8);
      }
      pPVar4->opaque = __s;
      return pPVar4;
    }
    pvVar6 = (*__PHYSFS_AllocatorHooks.Malloc)(0x4000);
    __s[3] = (long)pvVar6;
    if (pvVar6 != (void *)0x0) {
      iVar3 = mz_inflateInit2((mz_streamp)(__s + 7),iVar3);
      zlib_err(iVar3);
      if (iVar3 != 0) goto LAB_00119a89;
      goto LAB_00119aed;
    }
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
LAB_00119a89:
  if (__s != (long *)0x0) {
    if (__s[1] != 0) {
      (**(code **)(__s[1] + 0x48))();
    }
    if (((void *)__s[3] != (void *)0x0) &&
       ((*__PHYSFS_AllocatorHooks.Free)((void *)__s[3]), __s[0xe] != 0)) {
      (*(code *)__s[0x10])(__s[0x11]);
      __s[0xe] = 0;
    }
    (*__PHYSFS_AllocatorHooks.Free)(__s);
  }
  if (pPVar4 != (PHYSFS_Io *)0x0) {
    (*__PHYSFS_AllocatorHooks.Free)(pPVar4);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *ZIP_duplicate(PHYSFS_Io *io)
{
    ZIPfileinfo *origfinfo = (ZIPfileinfo *) io->opaque;
    PHYSFS_Io *retval = (PHYSFS_Io *) allocator.Malloc(sizeof (PHYSFS_Io));
    ZIPfileinfo *finfo = (ZIPfileinfo *) allocator.Malloc(sizeof (ZIPfileinfo));
    GOTO_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, failed);
    GOTO_IF(!finfo, PHYSFS_ERR_OUT_OF_MEMORY, failed);
    memset(finfo, '\0', sizeof (*finfo));

    finfo->entry = origfinfo->entry;
    finfo->io = zip_get_io(origfinfo->io, NULL, finfo->entry);
    GOTO_IF_ERRPASS(!finfo->io, failed);

    initializeZStream(&finfo->stream);
    if (finfo->entry->compression_method != COMPMETH_NONE)
    {
        finfo->buffer = (PHYSFS_uint8 *) allocator.Malloc(ZIP_READBUFSIZE);
        GOTO_IF(!finfo->buffer, PHYSFS_ERR_OUT_OF_MEMORY, failed);
        if (zlib_err(inflateInit2(&finfo->stream, -MAX_WBITS)) != Z_OK)
            goto failed;
    } /* if */

    memcpy(retval, io, sizeof (PHYSFS_Io));
    retval->opaque = finfo;
    return retval;

failed:
    if (finfo != NULL)
    {
        if (finfo->io != NULL)
            finfo->io->destroy(finfo->io);

        if (finfo->buffer != NULL)
        {
            allocator.Free(finfo->buffer);
            inflateEnd(&finfo->stream);
        } /* if */

        allocator.Free(finfo);
    } /* if */

    if (retval != NULL)
        allocator.Free(retval);

    return NULL;
}